

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O1

void __thiscall tt::Thread::setDefaultName(Thread *this)

{
  char local_48 [8];
  char buf [32];
  
  if ((this->m_name)._M_string_length == 0) {
    builtin_strncpy(local_48,"Thread",7);
    strlen(local_48);
    std::__cxx11::string::_M_replace((ulong)&this->m_name,0,(char *)0x0,(ulong)local_48);
  }
  return;
}

Assistant:

void Thread::setDefaultName(){
	if(m_name.empty()){
		char buf[32];

		snprintf(buf,sizeof(buf),"Thread");

		m_name = buf;
	}
}